

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator_target.hpp
# Opt level: O0

Result __thiscall
ruckig::TargetCalculator<0UL,_MinimalDynamicDofsVector>::calculate<false>
          (TargetCalculator<0UL,_MinimalDynamicDofsVector> *this,
          InputParameter<0UL,_MinimalDynamicDofsVector> *inp,
          Trajectory<0UL,_MinimalDynamicDofsVector> *traj,double delta_time,bool *was_interrupted)

{
  value_type vVar1;
  Direction limiting_direction;
  undefined8 uVar2;
  byte bVar3;
  bool bVar4;
  __optional_eq_t<unsigned_long,_unsigned_long> _Var5;
  uint uVar6;
  reference pvVar7;
  Block *this_00;
  reference pvVar8;
  MinimalDynamicDofsVector<double,_0UL> *pMVar9;
  MinimalDynamicDofsVector<ruckig::ControlInterface,_0UL> *this_01;
  reference pvVar10;
  MinimalDynamicDofsVector<ruckig::Synchronization,_0UL> *this_02;
  reference pvVar11;
  reference pvVar12;
  reference pvVar13;
  reference pvVar14;
  reference pvVar15;
  reference pvVar16;
  double *pdVar17;
  Profile *pPVar18;
  unsigned_long *puVar19;
  Interval *pIVar20;
  Vector<double> *pVVar21;
  StandardVector<Block,_0UL> *this_03;
  optional<ruckig::Block::Interval> *poVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double dVar33;
  double dVar34;
  optional<double> t_min;
  byte local_23c1;
  Synchronization local_1f84;
  ControlInterface local_1f7c;
  value_type local_1f70;
  value_type local_1f60;
  undefined1 local_1f50 [8];
  VelocitySecondOrderStep2 step2_4;
  undefined1 local_1f30 [8];
  VelocityThirdOrderStep2 step2_3;
  undefined1 local_1ef0 [8];
  PositionFirstOrderStep2 step2_2;
  undefined1 local_1ed0 [8];
  PositionSecondOrderStep2 step2_1;
  undefined1 local_1e88 [8];
  PositionThirdOrderStep2 step2;
  byte local_1d71;
  bool found_time_synchronization_1;
  double t_profile_1;
  Profile *p_2;
  double dStack_1d58;
  bool skip_synchronization;
  size_t dof_5;
  Synchronization *local_1d48;
  Synchronization *local_1d40;
  double local_1d38;
  double t_profile;
  Profile *p_1;
  size_t dof_4;
  Profile *pPStack_1d18;
  bool found_time_synchronization;
  Profile *p_limiting;
  Synchronization *local_1d08;
  Synchronization *local_1d00;
  Synchronization *local_1cf0;
  Synchronization *local_1ce8;
  double local_1ce0;
  size_t dof_3;
  _Storage<unsigned_long,_true> local_1cd0;
  double local_1cc8;
  size_t dof_2;
  size_t dof_1;
  _Storage<double,_true> _Stack_1cb0;
  bool has_zero_limits_1;
  undefined1 local_1ca8;
  undefined7 uStack_1ca7;
  undefined1 local_1c99;
  _Storage<unsigned_long,_true> _Stack_1c98;
  bool found_synchronization;
  optional<unsigned_long> limiting_dof;
  undefined1 local_1c80 [6];
  bool discrete_duration;
  bool has_zero_limits;
  VelocitySecondOrderStep1 step1_4;
  undefined1 local_1c68 [8];
  VelocityThirdOrderStep1 step1_3;
  undefined1 local_1578 [8];
  PositionFirstOrderStep1 step1_2;
  undefined1 local_1560 [8];
  PositionSecondOrderStep1 step1_1;
  undefined1 local_e68 [8];
  PositionThirdOrderStep1 step1;
  byte local_4b;
  bool found_profile;
  Profile *p;
  size_t dof;
  bool *was_interrupted_local;
  double delta_time_local;
  Trajectory<0UL,_MinimalDynamicDofsVector> *traj_local;
  InputParameter<0UL,_MinimalDynamicDofsVector> *inp_local;
  TargetCalculator<0UL,_MinimalDynamicDofsVector> *this_local;
  
  *was_interrupted = false;
  Trajectory<0UL,_MinimalDynamicDofsVector>::resize<0UL,_0>(traj,0);
  for (p = (Profile *)0x0; p < (Profile *)this->degrees_of_freedom;
      p = (Profile *)((long)(p->t)._M_elems + 1)) {
    pvVar7 = std::
             vector<MinimalDynamicDofsVector<ruckig::Profile,_0UL>,_std::allocator<MinimalDynamicDofsVector<ruckig::Profile,_0UL>_>_>
             ::operator[](&traj->profiles,0);
    this_00 = (Block *)MinimalDynamicDofsVector<ruckig::Profile,_0UL>::operator[](pvVar7,(size_t)p);
    bVar4 = std::optional::operator_cast_to_bool((optional *)&inp->min_velocity);
    if (bVar4) {
      pMVar9 = std::optional<MinimalDynamicDofsVector<double,_0UL>_>::value(&inp->min_velocity);
      local_1f60 = MinimalDynamicDofsVector<double,_0UL>::operator[](pMVar9,(size_t)p);
    }
    else {
      dVar23 = MinimalDynamicDofsVector<double,_0UL>::operator[](&inp->max_velocity,(size_t)p);
      local_1f60 = -dVar23;
    }
    pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&this->inp_min_velocity,(size_type)p);
    *pvVar8 = local_1f60;
    bVar4 = std::optional::operator_cast_to_bool((optional *)&inp->min_acceleration);
    if (bVar4) {
      pMVar9 = std::optional<MinimalDynamicDofsVector<double,_0UL>_>::value(&inp->min_acceleration);
      local_1f70 = MinimalDynamicDofsVector<double,_0UL>::operator[](pMVar9,(size_t)p);
    }
    else {
      dVar23 = MinimalDynamicDofsVector<double,_0UL>::operator[](&inp->max_acceleration,(size_t)p);
      local_1f70 = -dVar23;
    }
    pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&this->inp_min_acceleration,(size_type)p);
    *pvVar8 = local_1f70;
    bVar4 = std::optional::operator_cast_to_bool((optional *)&inp->per_dof_control_interface);
    if (bVar4) {
      this_01 = std::optional<MinimalDynamicDofsVector<ruckig::ControlInterface,_0UL>_>::value
                          (&inp->per_dof_control_interface);
      local_1f7c = MinimalDynamicDofsVector<ruckig::ControlInterface,_0UL>::operator[]
                             (this_01,(size_t)p);
    }
    else {
      local_1f7c = inp->control_interface;
    }
    pvVar10 = std::vector<ruckig::ControlInterface,_std::allocator<ruckig::ControlInterface>_>::
              operator[](&this->inp_per_dof_control_interface,(size_type)p);
    *pvVar10 = local_1f7c;
    bVar4 = std::optional::operator_cast_to_bool((optional *)&inp->per_dof_synchronization);
    if (bVar4) {
      this_02 = std::optional<MinimalDynamicDofsVector<ruckig::Synchronization,_0UL>_>::value
                          (&inp->per_dof_synchronization);
      local_1f84 = MinimalDynamicDofsVector<ruckig::Synchronization,_0UL>::operator[]
                             (this_02,(size_t)p);
    }
    else {
      local_1f84 = inp->synchronization;
    }
    pvVar11 = std::vector<ruckig::Synchronization,_std::allocator<ruckig::Synchronization>_>::
              operator[](&this->inp_per_dof_synchronization,(size_type)p);
    *pvVar11 = local_1f84;
    bVar4 = MinimalDynamicDofsVector<bool,_0UL>::operator[](&inp->enabled,(size_t)p);
    if (bVar4) {
      pvVar10 = std::vector<ruckig::ControlInterface,_std::allocator<ruckig::ControlInterface>_>::
                operator[](&this->inp_per_dof_control_interface,(size_type)p);
      if (*pvVar10 == Position) {
        dVar23 = MinimalDynamicDofsVector<double,_0UL>::operator[](&inp->max_jerk,(size_t)p);
        uVar6 = std::isinf(dVar23);
        if ((uVar6 & 1) == 0) {
          dVar32 = MinimalDynamicDofsVector<double,_0UL>::operator[]
                             (&inp->current_velocity,(size_t)p);
          dVar25 = MinimalDynamicDofsVector<double,_0UL>::operator[]
                             (&inp->current_acceleration,(size_t)p);
          dVar26 = MinimalDynamicDofsVector<double,_0UL>::operator[](&inp->max_velocity,(size_t)p);
          pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&this->inp_min_velocity,(size_type)p);
          dVar23 = *pvVar8;
          dVar30 = MinimalDynamicDofsVector<double,_0UL>::operator[]
                             (&inp->max_acceleration,(size_t)p);
          pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&this->inp_min_acceleration,(size_type)p);
          dVar24 = *pvVar8;
          dVar31 = MinimalDynamicDofsVector<double,_0UL>::operator[](&inp->max_jerk,(size_t)p);
          ruckig::BrakeProfile::get_position_brake_trajectory
                    (dVar32,dVar25,dVar26,dVar23,dVar30,dVar24,dVar31);
        }
        else {
          dVar23 = MinimalDynamicDofsVector<double,_0UL>::operator[]
                             (&inp->max_acceleration,(size_t)p);
          uVar6 = std::isinf(dVar23);
          if ((uVar6 & 1) == 0) {
            dVar24 = MinimalDynamicDofsVector<double,_0UL>::operator[]
                               (&inp->current_velocity,(size_t)p);
            dVar32 = MinimalDynamicDofsVector<double,_0UL>::operator[](&inp->max_velocity,(size_t)p)
            ;
            pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                               (&this->inp_min_velocity,(size_type)p);
            dVar23 = *pvVar8;
            dVar25 = MinimalDynamicDofsVector<double,_0UL>::operator[]
                               (&inp->max_acceleration,(size_t)p);
            pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                               (&this->inp_min_acceleration,(size_type)p);
            ruckig::BrakeProfile::get_second_order_position_brake_trajectory
                      (dVar24,dVar32,dVar23,dVar25,*pvVar8);
          }
        }
        dVar23 = MinimalDynamicDofsVector<double,_0UL>::operator[](&inp->current_position,(size_t)p)
        ;
        dVar24 = MinimalDynamicDofsVector<double,_0UL>::operator[](&inp->current_velocity,(size_t)p)
        ;
        dVar32 = MinimalDynamicDofsVector<double,_0UL>::operator[]
                           (&inp->current_acceleration,(size_t)p);
        dVar25 = MinimalDynamicDofsVector<double,_0UL>::operator[](&inp->target_position,(size_t)p);
        dVar26 = MinimalDynamicDofsVector<double,_0UL>::operator[](&inp->target_velocity,(size_t)p);
        dVar30 = MinimalDynamicDofsVector<double,_0UL>::operator[]
                           (&inp->target_acceleration,(size_t)p);
        Profile::set_boundary((Profile *)this_00,dVar23,dVar24,dVar32,dVar25,dVar26,dVar30);
      }
      else if (*pvVar10 == Velocity) {
        dVar23 = MinimalDynamicDofsVector<double,_0UL>::operator[](&inp->max_jerk,(size_t)p);
        uVar6 = std::isinf(dVar23);
        if ((uVar6 & 1) == 0) {
          dVar24 = MinimalDynamicDofsVector<double,_0UL>::operator[]
                             (&inp->current_acceleration,(size_t)p);
          dVar32 = MinimalDynamicDofsVector<double,_0UL>::operator[]
                             (&inp->max_acceleration,(size_t)p);
          pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&this->inp_min_acceleration,(size_type)p);
          dVar23 = *pvVar8;
          dVar25 = MinimalDynamicDofsVector<double,_0UL>::operator[](&inp->max_jerk,(size_t)p);
          ruckig::BrakeProfile::get_velocity_brake_trajectory(dVar24,dVar32,dVar23,dVar25);
        }
        else {
          ruckig::BrakeProfile::get_second_order_velocity_brake_trajectory();
        }
        dVar23 = MinimalDynamicDofsVector<double,_0UL>::operator[](&inp->current_position,(size_t)p)
        ;
        dVar24 = MinimalDynamicDofsVector<double,_0UL>::operator[](&inp->current_velocity,(size_t)p)
        ;
        dVar32 = MinimalDynamicDofsVector<double,_0UL>::operator[]
                           (&inp->current_acceleration,(size_t)p);
        dVar25 = MinimalDynamicDofsVector<double,_0UL>::operator[](&inp->target_velocity,(size_t)p);
        dVar26 = MinimalDynamicDofsVector<double,_0UL>::operator[]
                           (&inp->target_acceleration,(size_t)p);
        Profile::set_boundary_for_velocity((Profile *)this_00,dVar23,dVar24,dVar32,dVar25,dVar26);
      }
      dVar23 = MinimalDynamicDofsVector<double,_0UL>::operator[](&inp->max_jerk,(size_t)p);
      uVar6 = std::isinf(dVar23);
      if ((uVar6 & 1) == 0) {
        pvVar12 = std::array<double,_8UL>::operator[](&(this_00->p_min).p,0);
        pvVar15 = std::array<double,_8UL>::operator[](&(this_00->p_min).v,0);
        pvVar16 = std::array<double,_8UL>::operator[](&(this_00->p_min).a,0);
        BrakeProfile::finalize(&(this_00->p_min).brake,pvVar12,pvVar15,pvVar16);
      }
      else {
        dVar23 = MinimalDynamicDofsVector<double,_0UL>::operator[](&inp->max_acceleration,(size_t)p)
        ;
        uVar6 = std::isinf(dVar23);
        if ((uVar6 & 1) == 0) {
          pvVar12 = std::array<double,_8UL>::operator[](&(this_00->p_min).p,0);
          pvVar15 = std::array<double,_8UL>::operator[](&(this_00->p_min).v,0);
          pvVar16 = std::array<double,_8UL>::operator[](&(this_00->p_min).a,0);
          BrakeProfile::finalize_second_order(&(this_00->p_min).brake,pvVar12,pvVar15,pvVar16);
        }
      }
      local_4b = 0;
      pvVar10 = std::vector<ruckig::ControlInterface,_std::allocator<ruckig::ControlInterface>_>::
                operator[](&this->inp_per_dof_control_interface,(size_type)p);
      if (*pvVar10 == Position) {
        dVar23 = MinimalDynamicDofsVector<double,_0UL>::operator[](&inp->max_jerk,(size_t)p);
        uVar6 = std::isinf(dVar23);
        if ((uVar6 & 1) == 0) {
          pvVar12 = std::array<double,_8UL>::operator[](&(this_00->p_min).p,0);
          dVar23 = *pvVar12;
          pvVar12 = std::array<double,_8UL>::operator[](&(this_00->p_min).v,0);
          dVar24 = *pvVar12;
          pvVar12 = std::array<double,_8UL>::operator[](&(this_00->p_min).a,0);
          dVar32 = *pvVar12;
          dVar25 = (this_00->p_min).pf;
          dVar26 = (this_00->p_min).vf;
          dVar30 = (this_00->p_min).af;
          dVar27 = MinimalDynamicDofsVector<double,_0UL>::operator[](&inp->max_velocity,(size_t)p);
          pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&this->inp_min_velocity,(size_type)p);
          dVar31 = *pvVar8;
          dVar28 = MinimalDynamicDofsVector<double,_0UL>::operator[]
                             (&inp->max_acceleration,(size_t)p);
          pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&this->inp_min_acceleration,(size_type)p);
          dVar34 = *pvVar8;
          dVar29 = MinimalDynamicDofsVector<double,_0UL>::operator[](&inp->max_jerk,(size_t)p);
          ruckig::PositionThirdOrderStep1::PositionThirdOrderStep1
                    ((PositionThirdOrderStep1 *)local_e68,dVar23,dVar24,dVar32,dVar25,dVar26,dVar30,
                     dVar27,dVar31,dVar28,dVar34,dVar29);
          std::vector<ruckig::Block,_std::allocator<ruckig::Block>_>::operator[]
                    (&this->blocks,(size_type)p);
          local_4b = ruckig::PositionThirdOrderStep1::get_profile((Profile *)local_e68,this_00);
        }
        else {
          dVar23 = MinimalDynamicDofsVector<double,_0UL>::operator[]
                             (&inp->max_acceleration,(size_t)p);
          uVar6 = std::isinf(dVar23);
          if ((uVar6 & 1) == 0) {
            pvVar12 = std::array<double,_8UL>::operator[](&(this_00->p_min).p,0);
            dVar23 = *pvVar12;
            pvVar12 = std::array<double,_8UL>::operator[](&(this_00->p_min).v,0);
            dVar24 = *pvVar12;
            dVar32 = (this_00->p_min).pf;
            dVar25 = (this_00->p_min).vf;
            dVar30 = MinimalDynamicDofsVector<double,_0UL>::operator[](&inp->max_velocity,(size_t)p)
            ;
            pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                               (&this->inp_min_velocity,(size_type)p);
            dVar26 = *pvVar8;
            dVar31 = MinimalDynamicDofsVector<double,_0UL>::operator[]
                               (&inp->max_acceleration,(size_t)p);
            pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                               (&this->inp_min_acceleration,(size_type)p);
            ruckig::PositionSecondOrderStep1::PositionSecondOrderStep1
                      ((PositionSecondOrderStep1 *)local_1560,dVar23,dVar24,dVar32,dVar25,dVar30,
                       dVar26,dVar31,*pvVar8);
            std::vector<ruckig::Block,_std::allocator<ruckig::Block>_>::operator[]
                      (&this->blocks,(size_type)p);
            local_4b = ruckig::PositionSecondOrderStep1::get_profile((Profile *)local_1560,this_00);
          }
          else {
            pvVar12 = std::array<double,_8UL>::operator[](&(this_00->p_min).p,0);
            dVar23 = *pvVar12;
            dVar24 = (this_00->p_min).pf;
            dVar32 = MinimalDynamicDofsVector<double,_0UL>::operator[](&inp->max_velocity,(size_t)p)
            ;
            pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                               (&this->inp_min_velocity,(size_type)p);
            ruckig::PositionFirstOrderStep1::PositionFirstOrderStep1
                      ((PositionFirstOrderStep1 *)local_1578,dVar23,dVar24,dVar32,*pvVar8);
            std::vector<ruckig::Block,_std::allocator<ruckig::Block>_>::operator[]
                      (&this->blocks,(size_type)p);
            local_4b = ruckig::PositionFirstOrderStep1::get_profile((Profile *)local_1578,this_00);
          }
        }
        local_4b = local_4b & 1;
      }
      else if (*pvVar10 == Velocity) {
        dVar23 = MinimalDynamicDofsVector<double,_0UL>::operator[](&inp->max_jerk,(size_t)p);
        uVar6 = std::isinf(dVar23);
        if ((uVar6 & 1) == 0) {
          pvVar12 = std::array<double,_8UL>::operator[](&(this_00->p_min).v,0);
          dVar23 = *pvVar12;
          pvVar12 = std::array<double,_8UL>::operator[](&(this_00->p_min).a,0);
          dVar24 = *pvVar12;
          dVar32 = (this_00->p_min).vf;
          dVar25 = (this_00->p_min).af;
          dVar30 = MinimalDynamicDofsVector<double,_0UL>::operator[]
                             (&inp->max_acceleration,(size_t)p);
          pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&this->inp_min_acceleration,(size_type)p);
          dVar26 = *pvVar8;
          dVar31 = MinimalDynamicDofsVector<double,_0UL>::operator[](&inp->max_jerk,(size_t)p);
          ruckig::VelocityThirdOrderStep1::VelocityThirdOrderStep1
                    ((VelocityThirdOrderStep1 *)local_1c68,dVar23,dVar24,dVar32,dVar25,dVar30,dVar26
                     ,dVar31);
          std::vector<ruckig::Block,_std::allocator<ruckig::Block>_>::operator[]
                    (&this->blocks,(size_type)p);
          local_4b = ruckig::VelocityThirdOrderStep1::get_profile((Profile *)local_1c68,this_00);
        }
        else {
          pvVar12 = std::array<double,_8UL>::operator[](&(this_00->p_min).v,0);
          dVar23 = *pvVar12;
          dVar24 = (this_00->p_min).vf;
          dVar32 = MinimalDynamicDofsVector<double,_0UL>::operator[]
                             (&inp->max_acceleration,(size_t)p);
          pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&this->inp_min_acceleration,(size_type)p);
          ruckig::VelocitySecondOrderStep1::VelocitySecondOrderStep1
                    ((VelocitySecondOrderStep1 *)local_1c80,dVar23,dVar24,dVar32,*pvVar8);
          std::vector<ruckig::Block,_std::allocator<ruckig::Block>_>::operator[]
                    (&this->blocks,(size_type)p);
          local_4b = ruckig::VelocitySecondOrderStep1::get_profile((Profile *)local_1c80,this_00);
        }
        local_4b = local_4b & 1;
      }
      if (local_4b == 0) {
        dVar23 = MinimalDynamicDofsVector<double,_0UL>::operator[](&inp->max_acceleration,(size_t)p)
        ;
        bVar4 = true;
        if ((dVar23 != 0.0) || (NAN(dVar23))) {
          pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&this->inp_min_acceleration,(size_type)p);
          bVar4 = true;
          if ((*pvVar8 != 0.0) || (NAN(*pvVar8))) {
            dVar23 = MinimalDynamicDofsVector<double,_0UL>::operator[](&inp->max_jerk,(size_t)p);
            bVar4 = dVar23 == 0.0;
          }
        }
        if (bVar4) {
          return ErrorZeroLimits;
        }
        return ErrorExecutionTimeCalculation;
      }
      pvVar14 = std::vector<ruckig::Block,_std::allocator<ruckig::Block>_>::operator[]
                          (&this->blocks,(size_type)p);
      dVar23 = pvVar14->t_min;
      pdVar17 = MinimalDynamicDofsVector<double,_0UL>::operator[]
                          (&traj->independent_min_durations,(size_t)p);
      *pdVar17 = dVar23;
    }
    else {
      dVar23 = MinimalDynamicDofsVector<double,_0UL>::operator[](&inp->current_position,(size_t)p);
      pvVar12 = std::array<double,_8UL>::back(&(this_00->p_min).p);
      *pvVar12 = dVar23;
      dVar23 = MinimalDynamicDofsVector<double,_0UL>::operator[](&inp->current_velocity,(size_t)p);
      pvVar12 = std::array<double,_8UL>::back(&(this_00->p_min).v);
      *pvVar12 = dVar23;
      dVar23 = MinimalDynamicDofsVector<double,_0UL>::operator[]
                         (&inp->current_acceleration,(size_t)p);
      pvVar12 = std::array<double,_8UL>::back(&(this_00->p_min).a);
      *pvVar12 = dVar23;
      pvVar13 = std::array<double,_7UL>::back(&(this_00->p_min).t_sum);
      *pvVar13 = 0.0;
      pvVar14 = std::vector<ruckig::Block,_std::allocator<ruckig::Block>_>::operator[]
                          (&this->blocks,(size_type)p);
      pvVar14->t_min = 0.0;
      pvVar14 = std::vector<ruckig::Block,_std::allocator<ruckig::Block>_>::operator[]
                          (&this->blocks,(size_type)p);
      std::optional<ruckig::Block::Interval>::operator=(&pvVar14->a);
      pvVar14 = std::vector<ruckig::Block,_std::allocator<ruckig::Block>_>::operator[]
                          (&this->blocks,(size_type)p);
      std::optional<ruckig::Block::Interval>::operator=(&pvVar14->b);
    }
  }
  limiting_dof.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._14_1_ = inp->duration_discretization == Discrete;
  if (((this->degrees_of_freedom != 1) ||
      (bVar4 = std::optional::operator_cast_to_bool((optional *)&inp->minimum_duration), bVar4)) ||
     ((limiting_dof.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._14_1_ & 1) != 0)) {
    std::optional<unsigned_long>::optional((optional<unsigned_long> *)&stack0xffffffffffffe368);
    _Stack_1cb0 = (inp->minimum_duration).super__Optional_base<double,_true,_true>._M_payload.
                  super__Optional_payload_base<double>._M_payload;
    uVar2 = *(undefined8 *)
             &(inp->minimum_duration).super__Optional_base<double,_true,_true>._M_payload.
              super__Optional_payload_base<double>._M_engaged;
    local_1ca8 = (undefined1)uVar2;
    uStack_1ca7 = (undefined7)((ulong)uVar2 >> 8);
    pvVar7 = std::
             vector<MinimalDynamicDofsVector<ruckig::Profile,_0UL>,_std::allocator<MinimalDynamicDofsVector<ruckig::Profile,_0UL>_>_>
             ::operator[](&traj->profiles,0);
    t_min.super__Optional_base<double,_true,_true>._M_payload.super__Optional_payload_base<double>.
    _M_engaged = (bool)local_1ca8;
    t_min.super__Optional_base<double,_true,_true>._M_payload.super__Optional_payload_base<double>.
    _M_payload = _Stack_1cb0;
    t_min.super__Optional_base<double,_true,_true>._M_payload.super__Optional_payload_base<double>.
    _9_7_ = 0;
    local_1c99 = synchronize(this,t_min,&traj->duration,
                             (optional<unsigned_long> *)&stack0xffffffffffffe368,pvVar7,
                             (bool)(limiting_dof.super__Optional_base<unsigned_long,_true,_true>.
                                    _M_payload.super__Optional_payload_base<unsigned_long>._14_1_ &
                                   1),delta_time);
    if ((bool)local_1c99) {
      for (local_1cc8 = 0.0; (ulong)local_1cc8 < this->degrees_of_freedom;
          local_1cc8 = (double)((long)local_1cc8 + 1)) {
        bVar4 = MinimalDynamicDofsVector<bool,_0UL>::operator[](&inp->enabled,(size_t)local_1cc8);
        if ((bVar4) &&
           (pvVar11 = std::vector<ruckig::Synchronization,_std::allocator<ruckig::Synchronization>_>
                      ::operator[](&this->inp_per_dof_synchronization,(size_type)local_1cc8),
           *pvVar11 == None)) {
          pvVar14 = std::vector<ruckig::Block,_std::allocator<ruckig::Block>_>::operator[]
                              (&this->blocks,(size_type)local_1cc8);
          pvVar7 = std::
                   vector<MinimalDynamicDofsVector<ruckig::Profile,_0UL>,_std::allocator<MinimalDynamicDofsVector<ruckig::Profile,_0UL>_>_>
                   ::operator[](&traj->profiles,0);
          pPVar18 = MinimalDynamicDofsVector<ruckig::Profile,_0UL>::operator[]
                              (pvVar7,(size_t)local_1cc8);
          memcpy(pPVar18,pvVar14,0x23c);
          pvVar14 = std::vector<ruckig::Block,_std::allocator<ruckig::Block>_>::operator[]
                              (&this->blocks,(size_type)local_1cc8);
          if (traj->duration <= pvVar14->t_min && pvVar14->t_min != traj->duration) {
            pvVar14 = std::vector<ruckig::Block,_std::allocator<ruckig::Block>_>::operator[]
                                (&this->blocks,(size_type)local_1cc8);
            traj->duration = pvVar14->t_min;
            std::optional<unsigned_long>::optional<unsigned_long_&,_true>
                      ((optional<unsigned_long> *)&dof_3,(unsigned_long *)&local_1cc8);
            _Stack_1c98._M_value = dof_3;
            limiting_dof.super__Optional_base<unsigned_long,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_long>._M_payload = local_1cd0;
          }
        }
      }
      vVar1 = traj->duration;
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](&traj->cumulative_times,0);
      *pvVar8 = vVar1;
      if (traj->duration <= 7600.0) {
        if ((traj->duration != 0.0) || (NAN(traj->duration))) {
          if ((limiting_dof.super__Optional_base<unsigned_long,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_long>._14_1_ & 1) == 0) {
            local_1ce8 = (Synchronization *)
                         std::
                         vector<ruckig::Synchronization,_std::allocator<ruckig::Synchronization>_>::
                         begin(&this->inp_per_dof_synchronization);
            local_1cf0 = (Synchronization *)
                         std::
                         vector<ruckig::Synchronization,_std::allocator<ruckig::Synchronization>_>::
                         end(&this->inp_per_dof_synchronization);
            bVar4 = std::
                    all_of<__gnu_cxx::__normal_iterator<ruckig::Synchronization*,std::vector<ruckig::Synchronization,std::allocator<ruckig::Synchronization>>>,ruckig::TargetCalculator<0ul,MinimalDynamicDofsVector>::calculate<false>(ruckig::InputParameter<0ul,MinimalDynamicDofsVector>const&,ruckig::Trajectory<0ul,MinimalDynamicDofsVector>&,double,bool&)::_lambda(ruckig::Synchronization)_1_>
                              (local_1ce8,local_1cf0);
            if (bVar4) {
              return Working;
            }
          }
          bVar4 = std::optional::operator_cast_to_bool((optional *)&stack0xffffffffffffe368);
          if (bVar4) {
            local_1d00 = (Synchronization *)
                         std::
                         vector<ruckig::Synchronization,_std::allocator<ruckig::Synchronization>_>::
                         begin(&this->inp_per_dof_synchronization);
            local_1d08 = (Synchronization *)
                         std::
                         vector<ruckig::Synchronization,_std::allocator<ruckig::Synchronization>_>::
                         end(&this->inp_per_dof_synchronization);
            bVar4 = std::
                    any_of<__gnu_cxx::__normal_iterator<ruckig::Synchronization*,std::vector<ruckig::Synchronization,std::allocator<ruckig::Synchronization>>>,ruckig::TargetCalculator<0ul,MinimalDynamicDofsVector>::calculate<false>(ruckig::InputParameter<0ul,MinimalDynamicDofsVector>const&,ruckig::Trajectory<0ul,MinimalDynamicDofsVector>&,double,bool&)::_lambda(ruckig::Synchronization)_2_>
                              (local_1d00,local_1d08);
            if (bVar4) {
              pvVar7 = std::
                       vector<MinimalDynamicDofsVector<ruckig::Profile,_0UL>,_std::allocator<MinimalDynamicDofsVector<ruckig::Profile,_0UL>_>_>
                       ::operator[](&traj->profiles,0);
              puVar19 = std::optional<unsigned_long>::value
                                  ((optional<unsigned_long> *)&stack0xffffffffffffe368);
              pPStack_1d18 = MinimalDynamicDofsVector<ruckig::Profile,_0UL>::operator[]
                                       (pvVar7,*puVar19);
              limiting_direction = pPStack_1d18->direction;
              puVar19 = std::optional<unsigned_long>::value
                                  ((optional<unsigned_long> *)&stack0xffffffffffffe368);
              bVar4 = is_input_collinear(this,inp,limiting_direction,*puVar19);
              if (bVar4) {
                dof_4._7_1_ = 1;
                for (p_1 = (Profile *)0x0; p_1 < (Profile *)this->degrees_of_freedom;
                    p_1 = (Profile *)((long)(p_1->t)._M_elems + 1)) {
                  bVar4 = MinimalDynamicDofsVector<bool,_0UL>::operator[](&inp->enabled,(size_t)p_1)
                  ;
                  if (((bVar4) &&
                      (_Var5 = std::operator==((unsigned_long *)&p_1,
                                               (optional<unsigned_long> *)&stack0xffffffffffffe368),
                      !_Var5)) &&
                     (pvVar11 = std::
                                vector<ruckig::Synchronization,_std::allocator<ruckig::Synchronization>_>
                                ::operator[](&this->inp_per_dof_synchronization,(size_type)p_1),
                     *pvVar11 == Phase)) {
                    pvVar7 = std::
                             vector<MinimalDynamicDofsVector<ruckig::Profile,_0UL>,_std::allocator<MinimalDynamicDofsVector<ruckig::Profile,_0UL>_>_>
                             ::operator[](&traj->profiles,0);
                    t_profile = (double)MinimalDynamicDofsVector<ruckig::Profile,_0UL>::operator[]
                                                  (pvVar7,(size_t)p_1);
                    local_1d38 = (traj->duration - (((Profile *)t_profile)->brake).duration) -
                                 (((Profile *)t_profile)->accel).duration;
                    (((Profile *)t_profile)->t)._M_elems[6] = (pPStack_1d18->t)._M_elems[6];
                    dVar23 = (pPStack_1d18->t)._M_elems[0];
                    dVar24 = (pPStack_1d18->t)._M_elems[1];
                    dVar32 = (pPStack_1d18->t)._M_elems[2];
                    dVar25 = (pPStack_1d18->t)._M_elems[3];
                    dVar26 = (pPStack_1d18->t)._M_elems[5];
                    (((Profile *)t_profile)->t)._M_elems[4] = (pPStack_1d18->t)._M_elems[4];
                    (((Profile *)t_profile)->t)._M_elems[5] = dVar26;
                    (((Profile *)t_profile)->t)._M_elems[2] = dVar32;
                    (((Profile *)t_profile)->t)._M_elems[3] = dVar25;
                    (((Profile *)t_profile)->t)._M_elems[0] = dVar23;
                    (((Profile *)t_profile)->t)._M_elems[1] = dVar24;
                    ((Profile *)t_profile)->control_signs = pPStack_1d18->control_signs;
                    pvVar10 = std::
                              vector<ruckig::ControlInterface,_std::allocator<ruckig::ControlInterface>_>
                              ::operator[](&this->inp_per_dof_control_interface,(size_type)p_1);
                    if (*pvVar10 == Position) {
                      if (*(int *)((long)t_profile + 0x238) == 0) {
                        dVar23 = MinimalDynamicDofsVector<double,_0UL>::operator[]
                                           (&inp->max_jerk,(size_t)p_1);
                        uVar6 = std::isinf(dVar23);
                        dVar24 = t_profile;
                        dVar23 = local_1d38;
                        if ((uVar6 & 1) == 0) {
                          pdVar17 = MinimalDynamicDofsVector<double,_0UL>::operator[]
                                              (&this->new_phase_control,(size_t)p_1);
                          dVar32 = *pdVar17;
                          dVar30 = MinimalDynamicDofsVector<double,_0UL>::operator[]
                                             (&inp->max_velocity,(size_t)p_1);
                          pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                                             (&this->inp_min_velocity,(size_type)p_1);
                          dVar25 = *pvVar8;
                          dVar31 = MinimalDynamicDofsVector<double,_0UL>::operator[]
                                             (&inp->max_acceleration,(size_t)p_1);
                          pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                                             (&this->inp_min_acceleration,(size_type)p_1);
                          dVar26 = *pvVar8;
                          dVar34 = MinimalDynamicDofsVector<double,_0UL>::operator[]
                                             (&inp->max_jerk,(size_t)p_1);
                          bVar4 = Profile::
                                  check_with_timing<(ruckig::Profile::ControlSigns)0,(ruckig::Profile::ReachedLimits)7>
                                            ((Profile *)dVar24,dVar23,dVar32,dVar30,dVar25,dVar31,
                                             dVar26,dVar34);
                          bVar3 = dof_4._7_1_ & 1 & bVar4;
                        }
                        else {
                          dVar23 = MinimalDynamicDofsVector<double,_0UL>::operator[]
                                             (&inp->max_acceleration,(size_t)p_1);
                          uVar6 = std::isinf(dVar23);
                          dVar24 = t_profile;
                          dVar23 = local_1d38;
                          if ((uVar6 & 1) == 0) {
                            pdVar17 = MinimalDynamicDofsVector<double,_0UL>::operator[]
                                                (&this->new_phase_control,(size_t)p_1);
                            dVar32 = *pdVar17;
                            pdVar17 = MinimalDynamicDofsVector<double,_0UL>::operator[]
                                                (&this->new_phase_control,(size_t)p_1);
                            dVar25 = *pdVar17;
                            dVar30 = MinimalDynamicDofsVector<double,_0UL>::operator[]
                                               (&inp->max_velocity,(size_t)p_1);
                            pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                                               (&this->inp_min_velocity,(size_type)p_1);
                            dVar26 = *pvVar8;
                            dVar31 = MinimalDynamicDofsVector<double,_0UL>::operator[]
                                               (&inp->max_acceleration,(size_t)p_1);
                            pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                                               (&this->inp_min_acceleration,(size_type)p_1);
                            bVar4 = Profile::
                                    check_for_second_order_with_timing<(ruckig::Profile::ControlSigns)0,(ruckig::Profile::ReachedLimits)7>
                                              ((Profile *)dVar24,dVar23,dVar32,-dVar25,dVar30,dVar26
                                               ,dVar31,*pvVar8);
                            bVar3 = dof_4._7_1_ & 1 & bVar4;
                          }
                          else {
                            pdVar17 = MinimalDynamicDofsVector<double,_0UL>::operator[]
                                                (&this->new_phase_control,(size_t)p_1);
                            dVar32 = *pdVar17;
                            dVar25 = MinimalDynamicDofsVector<double,_0UL>::operator[]
                                               (&inp->max_velocity,(size_t)p_1);
                            pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                                               (&this->inp_min_velocity,(size_type)p_1);
                            bVar4 = Profile::
                                    check_for_first_order_with_timing<(ruckig::Profile::ControlSigns)0,(ruckig::Profile::ReachedLimits)7>
                                              ((Profile *)dVar24,dVar23,dVar32,dVar25,*pvVar8);
                            bVar3 = dof_4._7_1_ & 1 & bVar4;
                          }
                        }
                        dof_4._7_1_ = bVar3 != 0;
                      }
                      else if (*(int *)((long)t_profile + 0x238) == 1) {
                        dVar23 = MinimalDynamicDofsVector<double,_0UL>::operator[]
                                           (&inp->max_jerk,(size_t)p_1);
                        uVar6 = std::isinf(dVar23);
                        dVar24 = t_profile;
                        dVar23 = local_1d38;
                        if ((uVar6 & 1) == 0) {
                          pdVar17 = MinimalDynamicDofsVector<double,_0UL>::operator[]
                                              (&this->new_phase_control,(size_t)p_1);
                          dVar32 = *pdVar17;
                          dVar30 = MinimalDynamicDofsVector<double,_0UL>::operator[]
                                             (&inp->max_velocity,(size_t)p_1);
                          pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                                             (&this->inp_min_velocity,(size_type)p_1);
                          dVar25 = *pvVar8;
                          dVar31 = MinimalDynamicDofsVector<double,_0UL>::operator[]
                                             (&inp->max_acceleration,(size_t)p_1);
                          pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                                             (&this->inp_min_acceleration,(size_type)p_1);
                          dVar26 = *pvVar8;
                          dVar34 = MinimalDynamicDofsVector<double,_0UL>::operator[]
                                             (&inp->max_jerk,(size_t)p_1);
                          bVar4 = Profile::
                                  check_with_timing<(ruckig::Profile::ControlSigns)1,(ruckig::Profile::ReachedLimits)7>
                                            ((Profile *)dVar24,dVar23,dVar32,dVar30,dVar25,dVar31,
                                             dVar26,dVar34);
                          bVar3 = dof_4._7_1_ & 1 & bVar4;
                        }
                        else {
                          pdVar17 = MinimalDynamicDofsVector<double,_0UL>::operator[]
                                              (&this->new_phase_control,(size_t)p_1);
                          dVar32 = *pdVar17;
                          pdVar17 = MinimalDynamicDofsVector<double,_0UL>::operator[]
                                              (&this->new_phase_control,(size_t)p_1);
                          dVar25 = *pdVar17;
                          dVar30 = MinimalDynamicDofsVector<double,_0UL>::operator[]
                                             (&inp->max_velocity,(size_t)p_1);
                          pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                                             (&this->inp_min_velocity,(size_type)p_1);
                          dVar26 = *pvVar8;
                          dVar31 = MinimalDynamicDofsVector<double,_0UL>::operator[]
                                             (&inp->max_acceleration,(size_t)p_1);
                          pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                                             (&this->inp_min_acceleration,(size_type)p_1);
                          bVar4 = Profile::
                                  check_for_second_order_with_timing<(ruckig::Profile::ControlSigns)1,(ruckig::Profile::ReachedLimits)7>
                                            ((Profile *)dVar24,dVar23,dVar32,-dVar25,dVar30,dVar26,
                                             dVar31,*pvVar8);
                          bVar3 = dof_4._7_1_ & 1 & bVar4;
                        }
                        dof_4._7_1_ = bVar3 != 0;
                      }
                    }
                    else if (*pvVar10 == Velocity) {
                      if (*(int *)((long)t_profile + 0x238) == 0) {
                        dVar23 = MinimalDynamicDofsVector<double,_0UL>::operator[]
                                           (&inp->max_jerk,(size_t)p_1);
                        uVar6 = std::isinf(dVar23);
                        dVar24 = t_profile;
                        dVar23 = local_1d38;
                        if ((uVar6 & 1) == 0) {
                          pdVar17 = MinimalDynamicDofsVector<double,_0UL>::operator[]
                                              (&this->new_phase_control,(size_t)p_1);
                          dVar32 = *pdVar17;
                          dVar26 = MinimalDynamicDofsVector<double,_0UL>::operator[]
                                             (&inp->max_acceleration,(size_t)p_1);
                          pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                                             (&this->inp_min_acceleration,(size_type)p_1);
                          dVar25 = *pvVar8;
                          dVar30 = MinimalDynamicDofsVector<double,_0UL>::operator[]
                                             (&inp->max_jerk,(size_t)p_1);
                          bVar4 = Profile::
                                  check_for_velocity_with_timing<(ruckig::Profile::ControlSigns)0,(ruckig::Profile::ReachedLimits)7>
                                            ((Profile *)dVar24,dVar23,dVar32,dVar26,dVar25,dVar30);
                          bVar3 = dof_4._7_1_ & 1 & bVar4;
                        }
                        else {
                          pdVar17 = MinimalDynamicDofsVector<double,_0UL>::operator[]
                                              (&this->new_phase_control,(size_t)p_1);
                          dVar32 = *pdVar17;
                          dVar25 = MinimalDynamicDofsVector<double,_0UL>::operator[]
                                             (&inp->max_acceleration,(size_t)p_1);
                          pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                                             (&this->inp_min_acceleration,(size_type)p_1);
                          bVar4 = Profile::
                                  check_for_second_order_velocity_with_timing<(ruckig::Profile::ControlSigns)0,(ruckig::Profile::ReachedLimits)7>
                                            ((Profile *)dVar24,dVar23,dVar32,dVar25,*pvVar8);
                          bVar3 = dof_4._7_1_ & 1 & bVar4;
                        }
                        dof_4._7_1_ = bVar3 != 0;
                      }
                      else if (*(int *)((long)t_profile + 0x238) == 1) {
                        dVar23 = MinimalDynamicDofsVector<double,_0UL>::operator[]
                                           (&inp->max_jerk,(size_t)p_1);
                        uVar6 = std::isinf(dVar23);
                        dVar24 = t_profile;
                        dVar23 = local_1d38;
                        if ((uVar6 & 1) == 0) {
                          pdVar17 = MinimalDynamicDofsVector<double,_0UL>::operator[]
                                              (&this->new_phase_control,(size_t)p_1);
                          dVar32 = *pdVar17;
                          dVar26 = MinimalDynamicDofsVector<double,_0UL>::operator[]
                                             (&inp->max_acceleration,(size_t)p_1);
                          pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                                             (&this->inp_min_acceleration,(size_type)p_1);
                          dVar25 = *pvVar8;
                          dVar30 = MinimalDynamicDofsVector<double,_0UL>::operator[]
                                             (&inp->max_jerk,(size_t)p_1);
                          bVar4 = Profile::
                                  check_for_velocity_with_timing<(ruckig::Profile::ControlSigns)1,(ruckig::Profile::ReachedLimits)7>
                                            ((Profile *)dVar24,dVar23,dVar32,dVar26,dVar25,dVar30);
                          bVar3 = dof_4._7_1_ & 1 & bVar4;
                        }
                        else {
                          pdVar17 = MinimalDynamicDofsVector<double,_0UL>::operator[]
                                              (&this->new_phase_control,(size_t)p_1);
                          dVar32 = *pdVar17;
                          dVar25 = MinimalDynamicDofsVector<double,_0UL>::operator[]
                                             (&inp->max_acceleration,(size_t)p_1);
                          pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                                             (&this->inp_min_acceleration,(size_type)p_1);
                          bVar4 = Profile::
                                  check_for_second_order_velocity_with_timing<(ruckig::Profile::ControlSigns)1,(ruckig::Profile::ReachedLimits)7>
                                            ((Profile *)dVar24,dVar23,dVar32,dVar25,*pvVar8);
                          bVar3 = dof_4._7_1_ & 1 & bVar4;
                        }
                        dof_4._7_1_ = bVar3 != 0;
                      }
                    }
                    *(ReachedLimits *)((long)t_profile + 0x230) = pPStack_1d18->limits;
                  }
                }
                if ((dof_4._7_1_ & 1) != 0) {
                  local_1d40 = (Synchronization *)
                               std::
                               vector<ruckig::Synchronization,_std::allocator<ruckig::Synchronization>_>
                               ::begin(&this->inp_per_dof_synchronization);
                  local_1d48 = (Synchronization *)
                               std::
                               vector<ruckig::Synchronization,_std::allocator<ruckig::Synchronization>_>
                               ::end(&this->inp_per_dof_synchronization);
                  bVar4 = std::
                          all_of<__gnu_cxx::__normal_iterator<ruckig::Synchronization*,std::vector<ruckig::Synchronization,std::allocator<ruckig::Synchronization>>>,ruckig::TargetCalculator<0ul,MinimalDynamicDofsVector>::calculate<false>(ruckig::InputParameter<0ul,MinimalDynamicDofsVector>const&,ruckig::Trajectory<0ul,MinimalDynamicDofsVector>&,double,bool&)::_lambda(ruckig::Synchronization)_3_>
                                    (local_1d40,local_1d48);
                  if (bVar4) {
                    return Working;
                  }
                }
              }
            }
          }
          for (dStack_1d58 = 0.0; (ulong)dStack_1d58 < this->degrees_of_freedom;
              dStack_1d58 = (double)((long)dStack_1d58 + 1)) {
            _Var5 = std::operator==((unsigned_long *)&stack0xffffffffffffe2a8,
                                    (optional<unsigned_long> *)&stack0xffffffffffffe368);
            if (_Var5) {
LAB_001470a3:
              local_23c1 = limiting_dof.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                           super__Optional_payload_base<unsigned_long>._14_1_ ^ 0xff;
            }
            else {
              pvVar11 = std::
                        vector<ruckig::Synchronization,_std::allocator<ruckig::Synchronization>_>::
                        operator[](&this->inp_per_dof_synchronization,(size_type)dStack_1d58);
              local_23c1 = 0;
              if (*pvVar11 == None) goto LAB_001470a3;
            }
            bVar4 = MinimalDynamicDofsVector<bool,_0UL>::operator[]
                              (&inp->enabled,(size_t)dStack_1d58);
            if ((bVar4) && ((local_23c1 & 1) == 0)) {
              pvVar7 = std::
                       vector<MinimalDynamicDofsVector<ruckig::Profile,_0UL>,_std::allocator<MinimalDynamicDofsVector<ruckig::Profile,_0UL>_>_>
                       ::operator[](&traj->profiles,0);
              pPVar18 = MinimalDynamicDofsVector<ruckig::Profile,_0UL>::operator[]
                                  (pvVar7,(size_t)dStack_1d58);
              dVar23 = (traj->duration - (pPVar18->brake).duration) - (pPVar18->accel).duration;
              pvVar11 = std::
                        vector<ruckig::Synchronization,_std::allocator<ruckig::Synchronization>_>::
                        operator[](&this->inp_per_dof_synchronization,(size_type)dStack_1d58);
              if (*pvVar11 == TimeIfNecessary) {
                pVVar21 = &inp->target_velocity;
                MinimalDynamicDofsVector<double,_0UL>::operator[](pVVar21,(size_t)dStack_1d58);
                std::abs((int)pVVar21);
                if (extraout_XMM0_Qa < 2.220446049250313e-16) {
                  pVVar21 = &inp->target_acceleration;
                  MinimalDynamicDofsVector<double,_0UL>::operator[](pVVar21,(size_t)dStack_1d58);
                  std::abs((int)pVVar21);
                  if (extraout_XMM0_Qa_00 < 2.220446049250313e-16) {
                    pvVar14 = std::vector<ruckig::Block,_std::allocator<ruckig::Block>_>::operator[]
                                        (&this->blocks,(size_type)dStack_1d58);
                    memcpy(pPVar18,pvVar14,0x23c);
                    goto LAB_00147b48;
                  }
                }
              }
              this_03 = &this->blocks;
              std::vector<ruckig::Block,_std::allocator<ruckig::Block>_>::operator[]
                        (this_03,(size_type)dStack_1d58);
              std::abs((int)this_03);
              if (4.440892098500626e-16 <= extraout_XMM0_Qa_01) {
                pvVar14 = std::vector<ruckig::Block,_std::allocator<ruckig::Block>_>::operator[]
                                    (&this->blocks,(size_type)dStack_1d58);
                bVar4 = std::optional::operator_cast_to_bool((optional *)&pvVar14->a);
                if (bVar4) {
                  pvVar14 = std::vector<ruckig::Block,_std::allocator<ruckig::Block>_>::operator[]
                                      (&this->blocks,(size_type)dStack_1d58);
                  poVar22 = &pvVar14->a;
                  std::optional<ruckig::Block::Interval>::operator->(poVar22);
                  std::abs((int)poVar22);
                  if (extraout_XMM0_Qa_02 < 4.440892098500626e-16) {
                    pvVar14 = std::vector<ruckig::Block,_std::allocator<ruckig::Block>_>::operator[]
                                        (&this->blocks,(size_type)dStack_1d58);
                    pIVar20 = std::optional<ruckig::Block::Interval>::operator->(&pvVar14->a);
                    memcpy(pPVar18,pIVar20 + 0x10,0x23c);
                    goto LAB_00147b48;
                  }
                }
                pvVar14 = std::vector<ruckig::Block,_std::allocator<ruckig::Block>_>::operator[]
                                    (&this->blocks,(size_type)dStack_1d58);
                bVar4 = std::optional::operator_cast_to_bool((optional *)&pvVar14->b);
                if (bVar4) {
                  pvVar14 = std::vector<ruckig::Block,_std::allocator<ruckig::Block>_>::operator[]
                                      (&this->blocks,(size_type)dStack_1d58);
                  poVar22 = &pvVar14->b;
                  std::optional<ruckig::Block::Interval>::operator->(poVar22);
                  std::abs((int)poVar22);
                  if (extraout_XMM0_Qa_03 < 4.440892098500626e-16) {
                    pvVar14 = std::vector<ruckig::Block,_std::allocator<ruckig::Block>_>::operator[]
                                        (&this->blocks,(size_type)dStack_1d58);
                    pIVar20 = std::optional<ruckig::Block::Interval>::operator->(&pvVar14->b);
                    memcpy(pPVar18,pIVar20 + 0x10,0x23c);
                    goto LAB_00147b48;
                  }
                }
                local_1d71 = 0;
                pvVar10 = std::
                          vector<ruckig::ControlInterface,_std::allocator<ruckig::ControlInterface>_>
                          ::operator[](&this->inp_per_dof_control_interface,(size_type)dStack_1d58);
                if (*pvVar10 == Position) {
                  dVar24 = MinimalDynamicDofsVector<double,_0UL>::operator[]
                                     (&inp->max_jerk,(size_t)dStack_1d58);
                  uVar6 = std::isinf(dVar24);
                  if ((uVar6 & 1) == 0) {
                    pvVar12 = std::array<double,_8UL>::operator[](&pPVar18->p,0);
                    dVar24 = *pvVar12;
                    pvVar12 = std::array<double,_8UL>::operator[](&pPVar18->v,0);
                    dVar32 = *pvVar12;
                    pvVar12 = std::array<double,_8UL>::operator[](&pPVar18->a,0);
                    dVar25 = *pvVar12;
                    dVar26 = pPVar18->pf;
                    dVar30 = pPVar18->vf;
                    dVar31 = pPVar18->af;
                    dVar28 = MinimalDynamicDofsVector<double,_0UL>::operator[]
                                       (&inp->max_velocity,(size_t)dStack_1d58);
                    pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                                       (&this->inp_min_velocity,(size_type)dStack_1d58);
                    dVar34 = *pvVar8;
                    dVar29 = MinimalDynamicDofsVector<double,_0UL>::operator[]
                                       (&inp->max_acceleration,(size_t)dStack_1d58);
                    pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                                       (&this->inp_min_acceleration,(size_type)dStack_1d58);
                    dVar27 = *pvVar8;
                    dVar33 = MinimalDynamicDofsVector<double,_0UL>::operator[]
                                       (&inp->max_jerk,(size_t)dStack_1d58);
                    ruckig::PositionThirdOrderStep2::PositionThirdOrderStep2
                              ((PositionThirdOrderStep2 *)local_1e88,dVar23,dVar24,dVar32,dVar25,
                               dVar26,dVar30,dVar31,dVar28,dVar34,dVar29,dVar27,dVar33);
                    local_1d71 = ruckig::PositionThirdOrderStep2::get_profile((Profile *)local_1e88)
                    ;
                  }
                  else {
                    dVar24 = MinimalDynamicDofsVector<double,_0UL>::operator[]
                                       (&inp->max_acceleration,(size_t)dStack_1d58);
                    uVar6 = std::isinf(dVar24);
                    if ((uVar6 & 1) == 0) {
                      pvVar12 = std::array<double,_8UL>::operator[](&pPVar18->p,0);
                      dVar24 = *pvVar12;
                      pvVar12 = std::array<double,_8UL>::operator[](&pPVar18->v,0);
                      dVar32 = *pvVar12;
                      dVar25 = pPVar18->pf;
                      dVar26 = pPVar18->vf;
                      dVar31 = MinimalDynamicDofsVector<double,_0UL>::operator[]
                                         (&inp->max_velocity,(size_t)dStack_1d58);
                      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                                         (&this->inp_min_velocity,(size_type)dStack_1d58);
                      dVar30 = *pvVar8;
                      dVar34 = MinimalDynamicDofsVector<double,_0UL>::operator[]
                                         (&inp->max_acceleration,(size_t)dStack_1d58);
                      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                                         (&this->inp_min_acceleration,(size_type)dStack_1d58);
                      ruckig::PositionSecondOrderStep2::PositionSecondOrderStep2
                                ((PositionSecondOrderStep2 *)local_1ed0,dVar23,dVar24,dVar32,dVar25,
                                 dVar26,dVar31,dVar30,dVar34,*pvVar8);
                      local_1d71 = ruckig::PositionSecondOrderStep2::get_profile
                                             ((Profile *)local_1ed0);
                    }
                    else {
                      pvVar12 = std::array<double,_8UL>::operator[](&pPVar18->p,0);
                      dVar24 = *pvVar12;
                      dVar32 = pPVar18->pf;
                      dVar25 = MinimalDynamicDofsVector<double,_0UL>::operator[]
                                         (&inp->max_velocity,(size_t)dStack_1d58);
                      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                                         (&this->inp_min_velocity,(size_type)dStack_1d58);
                      ruckig::PositionFirstOrderStep2::PositionFirstOrderStep2
                                ((PositionFirstOrderStep2 *)local_1ef0,dVar23,dVar24,dVar32,dVar25,
                                 *pvVar8);
                      local_1d71 = ruckig::PositionFirstOrderStep2::get_profile
                                             ((Profile *)local_1ef0);
                    }
                  }
                  local_1d71 = local_1d71 & 1;
                }
                else if (*pvVar10 == Velocity) {
                  dVar24 = MinimalDynamicDofsVector<double,_0UL>::operator[]
                                     (&inp->max_jerk,(size_t)dStack_1d58);
                  uVar6 = std::isinf(dVar24);
                  if ((uVar6 & 1) == 0) {
                    pvVar12 = std::array<double,_8UL>::operator[](&pPVar18->v,0);
                    dVar24 = *pvVar12;
                    pvVar12 = std::array<double,_8UL>::operator[](&pPVar18->a,0);
                    dVar32 = *pvVar12;
                    dVar25 = pPVar18->vf;
                    dVar26 = pPVar18->af;
                    dVar31 = MinimalDynamicDofsVector<double,_0UL>::operator[]
                                       (&inp->max_acceleration,(size_t)dStack_1d58);
                    pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                                       (&this->inp_min_acceleration,(size_type)dStack_1d58);
                    dVar30 = *pvVar8;
                    dVar34 = MinimalDynamicDofsVector<double,_0UL>::operator[]
                                       (&inp->max_jerk,(size_t)dStack_1d58);
                    ruckig::VelocityThirdOrderStep2::VelocityThirdOrderStep2
                              ((VelocityThirdOrderStep2 *)local_1f30,dVar23,dVar24,dVar32,dVar25,
                               dVar26,dVar31,dVar30,dVar34);
                    local_1d71 = ruckig::VelocityThirdOrderStep2::get_profile((Profile *)local_1f30)
                    ;
                  }
                  else {
                    pvVar12 = std::array<double,_8UL>::operator[](&pPVar18->v,0);
                    dVar24 = *pvVar12;
                    dVar32 = pPVar18->vf;
                    dVar25 = MinimalDynamicDofsVector<double,_0UL>::operator[]
                                       (&inp->max_acceleration,(size_t)dStack_1d58);
                    pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                                       (&this->inp_min_acceleration,(size_type)dStack_1d58);
                    ruckig::VelocitySecondOrderStep2::VelocitySecondOrderStep2
                              ((VelocitySecondOrderStep2 *)local_1f50,dVar23,dVar24,dVar32,dVar25,
                               *pvVar8);
                    local_1d71 = ruckig::VelocitySecondOrderStep2::get_profile
                                           ((Profile *)local_1f50);
                  }
                  local_1d71 = local_1d71 & 1;
                }
                if (local_1d71 == 0) {
                  return ErrorSynchronizationCalculation;
                }
              }
              else {
                pvVar14 = std::vector<ruckig::Block,_std::allocator<ruckig::Block>_>::operator[]
                                    (&this->blocks,(size_type)dStack_1d58);
                memcpy(pPVar18,pvVar14,0x23c);
              }
            }
LAB_00147b48:
          }
          this_local._4_4_ = Working;
        }
        else {
          for (local_1ce0 = 0.0; (ulong)local_1ce0 < this->degrees_of_freedom;
              local_1ce0 = (double)((long)local_1ce0 + 1)) {
            pvVar14 = std::vector<ruckig::Block,_std::allocator<ruckig::Block>_>::operator[]
                                (&this->blocks,(size_type)local_1ce0);
            pvVar7 = std::
                     vector<MinimalDynamicDofsVector<ruckig::Profile,_0UL>,_std::allocator<MinimalDynamicDofsVector<ruckig::Profile,_0UL>_>_>
                     ::operator[](&traj->profiles,0);
            pPVar18 = MinimalDynamicDofsVector<ruckig::Profile,_0UL>::operator[]
                                (pvVar7,(size_t)local_1ce0);
            memcpy(pPVar18,pvVar14,0x23c);
          }
          this_local._4_4_ = Working;
        }
      }
      else {
        this_local._4_4_ = ErrorTrajectoryDuration;
      }
    }
    else {
      dof_1._7_1_ = 0;
      for (dof_2 = 0; dof_2 < this->degrees_of_freedom; dof_2 = dof_2 + 1) {
        dVar23 = MinimalDynamicDofsVector<double,_0UL>::operator[](&inp->max_acceleration,dof_2);
        if ((dVar23 == 0.0) && (!NAN(dVar23))) {
LAB_00145ffc:
          dof_1._7_1_ = 1;
          break;
        }
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&this->inp_min_acceleration,dof_2);
        if ((*pvVar8 == 0.0) && (!NAN(*pvVar8))) goto LAB_00145ffc;
        dVar23 = MinimalDynamicDofsVector<double,_0UL>::operator[](&inp->max_jerk,dof_2);
        if ((dVar23 == 0.0) && (!NAN(dVar23))) goto LAB_00145ffc;
      }
      if ((dof_1._7_1_ & 1) == 0) {
        this_local._4_4_ = ErrorSynchronizationCalculation;
      }
      else {
        this_local._4_4_ = ErrorZeroLimits;
      }
    }
  }
  else {
    pvVar14 = std::vector<ruckig::Block,_std::allocator<ruckig::Block>_>::operator[]
                        (&this->blocks,0);
    traj->duration = pvVar14->t_min;
    pvVar14 = std::vector<ruckig::Block,_std::allocator<ruckig::Block>_>::operator[]
                        (&this->blocks,0);
    pvVar7 = std::
             vector<MinimalDynamicDofsVector<ruckig::Profile,_0UL>,_std::allocator<MinimalDynamicDofsVector<ruckig::Profile,_0UL>_>_>
             ::operator[](&traj->profiles,0);
    pPVar18 = MinimalDynamicDofsVector<ruckig::Profile,_0UL>::operator[](pvVar7,0);
    memcpy(pPVar18,pvVar14,0x23c);
    vVar1 = traj->duration;
    pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](&traj->cumulative_times,0);
    *pvVar8 = vVar1;
    this_local._4_4_ = Working;
  }
  return this_local._4_4_;
}

Assistant:

Result calculate(const InputParameter<DOFs, CustomVector>& inp, Trajectory<DOFs, CustomVector>& traj, double delta_time, bool& was_interrupted) {
        was_interrupted = false;
#if defined WITH_CLOUD_CLIENT
        traj.resize(0);
#endif

        for (size_t dof = 0; dof < degrees_of_freedom; ++dof) {
            auto& p = traj.profiles[0][dof];

            inp_min_velocity[dof] = inp.min_velocity ? inp.min_velocity.value()[dof] : -inp.max_velocity[dof];
            inp_min_acceleration[dof] = inp.min_acceleration ? inp.min_acceleration.value()[dof] : -inp.max_acceleration[dof];
            inp_per_dof_control_interface[dof] = inp.per_dof_control_interface ? inp.per_dof_control_interface.value()[dof] : inp.control_interface;
            inp_per_dof_synchronization[dof] = inp.per_dof_synchronization ? inp.per_dof_synchronization.value()[dof] : inp.synchronization;

            if (!inp.enabled[dof]) {
                p.p.back() = inp.current_position[dof];
                p.v.back() = inp.current_velocity[dof];
                p.a.back() = inp.current_acceleration[dof];
                p.t_sum.back() = 0.0;
                blocks[dof].t_min = 0.0;
                blocks[dof].a = std::nullopt;
                blocks[dof].b = std::nullopt;
                continue;
            }

            // Calculate brake (if input exceeds or will exceed limits)
            switch (inp_per_dof_control_interface[dof]) {
                case ControlInterface::Position: {
                    if (!std::isinf(inp.max_jerk[dof])) {
                        p.brake.get_position_brake_trajectory(inp.current_velocity[dof], inp.current_acceleration[dof], inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]);
                        // p.accel.get_position_brake_trajectory(inp.target_velocity[dof], inp.target_acceleration[dof], inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]);
                    } else if (!std::isinf(inp.max_acceleration[dof])) {
                        p.brake.get_second_order_position_brake_trajectory(inp.current_velocity[dof], inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof]);
                        // p.accel.get_second_order_position_brake_trajectory(inp.target_velocity[dof], inp.target_acceleration[dof], inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof]);
                    }
                    p.set_boundary(inp.current_position[dof], inp.current_velocity[dof], inp.current_acceleration[dof], inp.target_position[dof], inp.target_velocity[dof], inp.target_acceleration[dof]);
                } break;
                case ControlInterface::Velocity: {
                    if (!std::isinf(inp.max_jerk[dof])) {
                        p.brake.get_velocity_brake_trajectory(inp.current_acceleration[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]);
                        // p.accel.get_velocity_brake_trajectory(inp.target_acceleration[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]);
                    } else {
                        p.brake.get_second_order_velocity_brake_trajectory();
                        // p.accel.get_second_order_velocity_brake_trajectory();
                    }
                    p.set_boundary_for_velocity(inp.current_position[dof], inp.current_velocity[dof], inp.current_acceleration[dof], inp.target_velocity[dof], inp.target_acceleration[dof]);
                } break;
            }

            // Finalize pre & post-trajectories
            if (!std::isinf(inp.max_jerk[dof])) {
                p.brake.finalize(p.p[0], p.v[0], p.a[0]);
                // p.accel.finalize(p.pf, p.vf, p.af);
            } else if (!std::isinf(inp.max_acceleration[dof])) {
                p.brake.finalize_second_order(p.p[0], p.v[0], p.a[0]);
                // p.accel.finalize_second_order(p.pf, p.vf, p.af);
            }

            bool found_profile {false};
            switch (inp_per_dof_control_interface[dof]) {
                case ControlInterface::Position: {
                    if (!std::isinf(inp.max_jerk[dof])) {
                        PositionThirdOrderStep1 step1 {p.p[0], p.v[0], p.a[0], p.pf, p.vf, p.af, inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]};
                        found_profile = step1.get_profile(p, blocks[dof]);
                    } else if (!std::isinf(inp.max_acceleration[dof])) {
                        PositionSecondOrderStep1 step1 {p.p[0], p.v[0], p.pf, p.vf, inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof]};
                        found_profile = step1.get_profile(p, blocks[dof]);
                    } else {
                        PositionFirstOrderStep1 step1 {p.p[0], p.pf, inp.max_velocity[dof], inp_min_velocity[dof]};
                        found_profile = step1.get_profile(p, blocks[dof]);
                    }
                } break;
                case ControlInterface::Velocity: {
                    if (!std::isinf(inp.max_jerk[dof])) {
                        VelocityThirdOrderStep1 step1 {p.v[0], p.a[0], p.vf, p.af, inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]};
                        found_profile = step1.get_profile(p, blocks[dof]);
                    } else {
                        VelocitySecondOrderStep1 step1 {p.v[0], p.vf, inp.max_acceleration[dof], inp_min_acceleration[dof]};
                        found_profile = step1.get_profile(p, blocks[dof]);
                    }
                } break;
            }

            if (!found_profile) {
                const bool has_zero_limits = (inp.max_acceleration[dof] == 0.0 || inp_min_acceleration[dof] == 0.0 || inp.max_jerk[dof] == 0.0);
                if (has_zero_limits) {
                    if constexpr (throw_error) {
                        throw RuckigError("zero limits conflict in step 1, dof: " + std::to_string(dof) + " input: " + inp.to_string());
                    } else {
                        return Result::ErrorZeroLimits;
                    }

                } else {
                    if constexpr (throw_error) {
                        throw RuckigError("error in step 1, dof: " + std::to_string(dof) + " input: " + inp.to_string());
                    } else {
                        return Result::ErrorExecutionTimeCalculation;
                    }
                }
            }

            traj.independent_min_durations[dof] = blocks[dof].t_min;
            // std::cout << dof << " profile step1: " << blocks[dof].to_string() << std::endl;
        }

        const bool discrete_duration = (inp.duration_discretization == DurationDiscretization::Discrete);
        if (degrees_of_freedom == 1 && !inp.minimum_duration && !discrete_duration) {
            traj.duration = blocks[0].t_min;
            traj.profiles[0][0] = blocks[0].p_min;
            traj.cumulative_times[0] = traj.duration;
            return Result::Working;
        }

        std::optional<size_t> limiting_dof; // The DoF that doesn't need step 2
        const bool found_synchronization = synchronize(inp.minimum_duration, traj.duration, limiting_dof, traj.profiles[0], discrete_duration, delta_time);
        if (!found_synchronization) {
            bool has_zero_limits = false;
            for (size_t dof = 0; dof < degrees_of_freedom; ++dof) {
                if (inp.max_acceleration[dof] == 0.0 || inp_min_acceleration[dof] == 0.0 || inp.max_jerk[dof] == 0.0) {
                    has_zero_limits = true;
                    break;
                }
            }

            if (has_zero_limits) {
                if constexpr (throw_error) {
                    throw RuckigError("zero limits conflict with other degrees of freedom in time synchronization " + std::to_string(traj.duration));
                } else {
                    return Result::ErrorZeroLimits;
                }

            } else {
                if constexpr (throw_error) {
                    throw RuckigError("error in time synchronization: " + std::to_string(traj.duration));
                } else {
                    return Result::ErrorSynchronizationCalculation;
                }
            }
        }

        // None Synchronization
        for (size_t dof = 0; dof < degrees_of_freedom; ++dof) {
            if (inp.enabled[dof] && inp_per_dof_synchronization[dof] == Synchronization::None) {
                traj.profiles[0][dof] = blocks[dof].p_min;
                if (blocks[dof].t_min > traj.duration) {
                    traj.duration = blocks[dof].t_min;
                    limiting_dof = dof;
                }
            }
        }
        traj.cumulative_times[0] = traj.duration;

        if constexpr (return_error_at_maximal_duration) {
            if (traj.duration > 7.6e3) {
                return Result::ErrorTrajectoryDuration;
            }
        }

        if (traj.duration == 0.0) {
            // Copy all profiles for end state
            for (size_t dof = 0; dof < degrees_of_freedom; ++dof) {
                traj.profiles[0][dof] = blocks[dof].p_min;
            }
            return Result::Working;
        }

        if (!discrete_duration && std::all_of(inp_per_dof_synchronization.begin(), inp_per_dof_synchronization.end(), [](Synchronization s){ return s == Synchronization::None; })) {
            return Result::Working;
        }

        // Phase Synchronization
        if (limiting_dof && std::any_of(inp_per_dof_synchronization.begin(), inp_per_dof_synchronization.end(), [](Synchronization s){ return s == Synchronization::Phase; })) {
            const Profile& p_limiting = traj.profiles[0][limiting_dof.value()];
            if (is_input_collinear(inp, p_limiting.direction, limiting_dof.value())) {
                bool found_time_synchronization {true};
                for (size_t dof = 0; dof < degrees_of_freedom; ++dof) {
                    if (!inp.enabled[dof] || dof == limiting_dof || inp_per_dof_synchronization[dof] != Synchronization::Phase) {
                        continue;
                    }

                    Profile& p = traj.profiles[0][dof];
                    const double t_profile = traj.duration - p.brake.duration - p.accel.duration;

                    p.t = p_limiting.t; // Copy timing information from limiting DoF
                    p.control_signs = p_limiting.control_signs;

                    // Profile::ReachedLimits::NONE is a small hack, as there is no specialization for that in the check function
                    switch (inp_per_dof_control_interface[dof]) {
                        case ControlInterface::Position: {
                            switch (p.control_signs) {
                                case Profile::ControlSigns::UDDU: {
                                    if (!std::isinf(inp.max_jerk[dof])) {
                                        found_time_synchronization &= p.check_with_timing<Profile::ControlSigns::UDDU, Profile::ReachedLimits::NONE>(t_profile, new_phase_control[dof], inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]);
                                    } else if (!std::isinf(inp.max_acceleration[dof])) {
                                        found_time_synchronization &= p.check_for_second_order_with_timing<Profile::ControlSigns::UDDU, Profile::ReachedLimits::NONE>(t_profile, new_phase_control[dof], -new_phase_control[dof], inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof]);
                                    } else {
                                        found_time_synchronization &= p.check_for_first_order_with_timing<Profile::ControlSigns::UDDU, Profile::ReachedLimits::NONE>(t_profile, new_phase_control[dof], inp.max_velocity[dof], inp_min_velocity[dof]);
                                    }
                                } break;
                                case Profile::ControlSigns::UDUD: {
                                    if (!std::isinf(inp.max_jerk[dof])) {
                                        found_time_synchronization &= p.check_with_timing<Profile::ControlSigns::UDUD, Profile::ReachedLimits::NONE>(t_profile, new_phase_control[dof], inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]);
                                    } else {
                                        found_time_synchronization &= p.check_for_second_order_with_timing<Profile::ControlSigns::UDUD, Profile::ReachedLimits::NONE>(t_profile, new_phase_control[dof], -new_phase_control[dof], inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof]);
                                    }
                                } break;
                            }
                        } break;
                        case ControlInterface::Velocity: {
                            switch (p.control_signs) {
                                case Profile::ControlSigns::UDDU: {
                                    if (!std::isinf(inp.max_jerk[dof])) {
                                        found_time_synchronization &= p.check_for_velocity_with_timing<Profile::ControlSigns::UDDU, Profile::ReachedLimits::NONE>(t_profile, new_phase_control[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]);
                                    } else {
                                        found_time_synchronization &= p.check_for_second_order_velocity_with_timing<Profile::ControlSigns::UDDU, Profile::ReachedLimits::NONE>(t_profile, new_phase_control[dof], inp.max_acceleration[dof], inp_min_acceleration[dof]);
                                    }
                                } break;
                                case Profile::ControlSigns::UDUD: {
                                    if (!std::isinf(inp.max_jerk[dof])) {
                                        found_time_synchronization &= p.check_for_velocity_with_timing<Profile::ControlSigns::UDUD, Profile::ReachedLimits::NONE>(t_profile, new_phase_control[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]);
                                    } else {
                                        found_time_synchronization &= p.check_for_second_order_velocity_with_timing<Profile::ControlSigns::UDUD, Profile::ReachedLimits::NONE>(t_profile, new_phase_control[dof], inp.max_acceleration[dof], inp_min_acceleration[dof]);
                                    }
                                } break;
                            }
                        } break;
                    }

                    p.limits = p_limiting.limits; // After check method call to set correct limits
                }

                if (found_time_synchronization && std::all_of(inp_per_dof_synchronization.begin(), inp_per_dof_synchronization.end(), [](Synchronization s){ return s == Synchronization::Phase || s == Synchronization::None; })) {
                    return Result::Working;
                }
            }
        }

        // Time Synchronization
        for (size_t dof = 0; dof < degrees_of_freedom; ++dof) {
            const bool skip_synchronization = (dof == limiting_dof || inp_per_dof_synchronization[dof] == Synchronization::None) && !discrete_duration;
            if (!inp.enabled[dof] || skip_synchronization) {
                continue;
            }

            Profile& p = traj.profiles[0][dof];
            const double t_profile = traj.duration - p.brake.duration - p.accel.duration;

            if (inp_per_dof_synchronization[dof] == Synchronization::TimeIfNecessary && std::abs(inp.target_velocity[dof]) < eps && std::abs(inp.target_acceleration[dof]) < eps) {
                p = blocks[dof].p_min;
                continue;
            }

            // Check if the final time corresponds to an extremal profile calculated in step 1
            // Use 2*eps because of numerical robustness in duration discretization
            if (std::abs(t_profile - blocks[dof].t_min) < 2*eps) {
                p = blocks[dof].p_min;
                continue;
            } else if (blocks[dof].a && std::abs(t_profile - blocks[dof].a->right) < 2*eps) {
                p = blocks[dof].a->profile;
                continue;
            } else if (blocks[dof].b && std::abs(t_profile - blocks[dof].b->right) < 2*eps) {
                p = blocks[dof].b->profile;
                continue;
            }

            bool found_time_synchronization {false};
            switch (inp_per_dof_control_interface[dof]) {
                case ControlInterface::Position: {
                    if (!std::isinf(inp.max_jerk[dof])) {
                        PositionThirdOrderStep2 step2 {t_profile, p.p[0], p.v[0], p.a[0], p.pf, p.vf, p.af, inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]};
                        found_time_synchronization = step2.get_profile(p);
                    } else if (!std::isinf(inp.max_acceleration[dof])) {
                        PositionSecondOrderStep2 step2 {t_profile, p.p[0], p.v[0], p.pf, p.vf, inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof]};
                        found_time_synchronization = step2.get_profile(p);
                    } else {
                        PositionFirstOrderStep2 step2 {t_profile, p.p[0], p.pf, inp.max_velocity[dof], inp_min_velocity[dof]};
                        found_time_synchronization = step2.get_profile(p);
                    }
                } break;
                case ControlInterface::Velocity: {
                    if (!std::isinf(inp.max_jerk[dof])) {
                        VelocityThirdOrderStep2 step2 {t_profile, p.v[0], p.a[0], p.vf, p.af, inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]};
                        found_time_synchronization = step2.get_profile(p);
                    } else {
                        VelocitySecondOrderStep2 step2 {t_profile, p.v[0], p.vf, inp.max_acceleration[dof], inp_min_acceleration[dof]};
                        found_time_synchronization = step2.get_profile(p);
                    }
                } break;
            }
            if (!found_time_synchronization) {
                if constexpr (throw_error) {
                    throw RuckigError("error in step 2 in dof: " + std::to_string(dof) + " for t sync: " + std::to_string(traj.duration) + " input: " + inp.to_string());
                } else {
                    return Result::ErrorSynchronizationCalculation;
                }
            }
            // std::cout << dof << " profile step2: " << p.to_string() << std::endl;
        }

        return Result::Working;
    }